

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O1

Aig_Man_t *
LivenessToSafetyTransformationAbs
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Int_t *vFlops,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair
          ,Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Aig_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Aig_Obj_t *pAVar12;
  char *pcVar13;
  ulong uVar14;
  Aig_Obj_t *pAVar15;
  Aig_Obj_t *pAVar16;
  Aig_Obj_t *pAVar17;
  Aig_Obj_t *p0;
  Aig_Obj_t *pAVar18;
  Aig_Obj_t *pAVar19;
  int iVar20;
  Aig_Obj_t *pAVar21;
  long lVar22;
  Aig_Obj_t *local_98;
  Aig_Obj_t *local_68;
  Aig_Obj_t *local_60;
  Aig_Obj_t *local_48;
  
  uVar5 = p->nTruePis;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  iVar20 = 8;
  if (6 < uVar5) {
    iVar20 = uVar5 + 1;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar20;
  if (iVar20 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)iVar20 * 8);
  }
  pVVar8->pArray = ppvVar9;
  vecPis = pVVar8;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar20;
  if (iVar20 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)iVar20 << 3);
  }
  pVVar8->pArray = ppvVar9;
  iVar20 = vFair->nSize;
  iVar4 = p->nRegs + vFlops->nSize + vLive->nSize;
  vecPiNames = pVVar8;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < (uint)(iVar4 + iVar20)) {
    iVar6 = iVar20 + iVar4 + 1;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)iVar6 * 8);
  }
  pVVar8->pArray = ppvVar9;
  vecLos = pVVar8;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar8->pArray = ppvVar9;
  vecLoNames = pVVar8;
  p_00 = Aig_ManStart(p->vObjs->nSize * 2);
  pcVar13 = pNtk->pName;
  sVar10 = strlen(pcVar13);
  pcVar11 = (char *)malloc(sVar10 + 5);
  p_00->pName = pcVar11;
  sprintf(pcVar11,"%s_%s",pcVar13,"l2s");
  p_00->pSpec = (char *)0x0;
  pAVar15 = p->pConst1;
  pAVar15->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < p->nTruePis) {
    lVar22 = 0;
    do {
      if (p->vCis->nSize <= lVar22) goto LAB_00622833;
      pAVar15 = (Aig_Obj_t *)p->vCis->pArray[lVar22];
      pAVar12 = Aig_ObjCreateCi(p_00);
      (pAVar15->field_5).pData = pAVar12;
      pVVar8 = vecPis;
      uVar5 = vecPis->nCap;
      if (vecPis->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecPis->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecPis->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar20 = 0x10;
        }
        else {
          iVar20 = uVar5 * 2;
          if (iVar20 <= (int)uVar5) goto LAB_006216f3;
          if (vecPis->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecPis->pArray,(ulong)uVar5 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar20;
      }
LAB_006216f3:
      iVar20 = pVVar8->nSize;
      pVVar8->nSize = iVar20 + 1;
      pVVar8->pArray[iVar20] = pAVar12;
      if (pNtk->vPis->nSize <= lVar22) goto LAB_00622833;
      pcVar13 = Abc_ObjName((Abc_Obj_t *)pNtk->vPis->pArray[lVar22]);
      if (pcVar13 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar13);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar13);
      }
      pVVar8 = vecPiNames;
      uVar5 = vecPiNames->nCap;
      if (vecPiNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecPiNames->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar20 = 0x10;
        }
        else {
          iVar20 = uVar5 * 2;
          if (iVar20 <= (int)uVar5) goto LAB_006217c2;
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecPiNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar20;
      }
LAB_006217c2:
      iVar20 = pVVar8->nSize;
      pVVar8->nSize = iVar20 + 1;
      pVVar8->pArray[iVar20] = pcVar11;
      lVar22 = lVar22 + 1;
    } while (lVar22 < p->nTruePis);
  }
  if ((mode & 0xfffffffdU) == 0) {
    local_98 = Aig_ObjCreateCi(p_00);
    pVVar8 = vecPiNames;
    uVar5 = vecPiNames->nCap;
    if (vecPiNames->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc(0x80);
        }
        else {
          ppvVar9 = (void **)realloc(vecPiNames->pArray,0x80);
        }
        pVVar8->pArray = ppvVar9;
        iVar20 = 0x10;
      }
      else {
        iVar20 = uVar5 * 2;
        if (iVar20 <= (int)uVar5) goto LAB_00621884;
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar9 = (void **)realloc(vecPiNames->pArray,(ulong)uVar5 << 4);
        }
        pVVar8->pArray = ppvVar9;
      }
      pVVar8->nCap = iVar20;
    }
LAB_00621884:
    iVar20 = pVVar8->nSize;
    pVVar8->nSize = iVar20 + 1;
    pVVar8->pArray[iVar20] = "SAVE_BIERE";
  }
  else {
    local_98 = (Aig_Obj_t *)0x0;
  }
  if (0 < p->nRegs) {
    iVar20 = 0;
    do {
      uVar5 = p->nTruePis + iVar20;
      if (((int)uVar5 < 0) || (p->vCis->nSize <= (int)uVar5)) goto LAB_00622833;
      pAVar15 = (Aig_Obj_t *)p->vCis->pArray[uVar5];
      pAVar12 = Aig_ObjCreateCi(p_00);
      (pAVar15->field_5).pData = pAVar12;
      pVVar8 = vecLos;
      uVar5 = vecLos->nCap;
      if (vecLos->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar5 * 2;
          if (iVar6 <= (int)uVar5) goto LAB_0062194e;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar6;
      }
LAB_0062194e:
      iVar6 = pVVar8->nSize;
      pVVar8->nSize = iVar6 + 1;
      pVVar8->pArray[iVar6] = pAVar12;
      uVar5 = pNtk->vPis->nSize + iVar20;
      if (((int)uVar5 < 0) || (pNtk->vCis->nSize <= (int)uVar5)) goto LAB_00622833;
      pcVar13 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar5]);
      if (pcVar13 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        sVar10 = strlen(pcVar13);
        pcVar11 = (char *)malloc(sVar10 + 1);
        strcpy(pcVar11,pcVar13);
      }
      pVVar8 = vecLoNames;
      uVar5 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar5 * 2;
          if (iVar6 <= (int)uVar5) goto LAB_00621a2e;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar6;
      }
LAB_00621a2e:
      iVar6 = pVVar8->nSize;
      pVVar8->nSize = iVar6 + 1;
      pVVar8->pArray[iVar6] = pcVar11;
      iVar20 = iVar20 + 1;
    } while (iVar20 < p->nRegs);
  }
  if ((mode & 0xfffffffdU) == 0) {
    pAVar12 = Aig_ObjCreateCi(p_00);
    pVVar8 = vecLos;
    uVar5 = vecLos->nCap;
    if (vecLos->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vecLos->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc(0x80);
        }
        else {
          ppvVar9 = (void **)realloc(vecLos->pArray,0x80);
        }
        pVVar8->pArray = ppvVar9;
        iVar20 = 0x10;
      }
      else {
        iVar20 = uVar5 * 2;
        if (iVar20 <= (int)uVar5) goto LAB_00621ae3;
        if (vecLos->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar9 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
        }
        pVVar8->pArray = ppvVar9;
      }
      pVVar8->nCap = iVar20;
    }
LAB_00621ae3:
    iVar20 = pVVar8->nSize;
    pVVar8->nSize = iVar20 + 1;
    pVVar8->pArray[iVar20] = pAVar12;
    pVVar8 = vecLoNames;
    uVar5 = vecLoNames->nCap;
    if (vecLoNames->nSize == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (vecLoNames->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc(0x80);
        }
        else {
          ppvVar9 = (void **)realloc(vecLoNames->pArray,0x80);
        }
        pVVar8->pArray = ppvVar9;
        iVar20 = 0x10;
      }
      else {
        iVar20 = uVar5 * 2;
        if (iVar20 <= (int)uVar5) goto LAB_00621b67;
        if (vecLoNames->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
        }
        else {
          ppvVar9 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
        }
        pVVar8->pArray = ppvVar9;
      }
      pVVar8->nCap = iVar20;
    }
LAB_00621b67:
    iVar20 = pVVar8->nSize;
    pVVar8->nSize = iVar20 + 1;
    pVVar8->pArray[iVar20] = "SAVED_LO";
  }
  else {
    pAVar12 = (Aig_Obj_t *)0x0;
  }
  if ((mode & 0xfffffffdU) == 0) {
    local_68 = Aig_Or(p_00,local_98,pAVar12);
    local_60 = Aig_And(p_00,local_98,(Aig_Obj_t *)((ulong)pAVar12 ^ 1));
  }
  else {
    local_60 = (Aig_Obj_t *)0x0;
    local_68 = (Aig_Obj_t *)0x0;
  }
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    lVar22 = 0;
    do {
      pAVar15 = (Aig_Obj_t *)pVVar8->pArray[lVar22];
      if ((pAVar15 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar15->field_0x18 & 7) - 7)) {
        if (((ulong)pAVar15 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar14 = (ulong)pAVar15->pFanin0 & 0xfffffffffffffffe;
        if (uVar14 == 0) {
          pAVar21 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar21 = (Aig_Obj_t *)((ulong)((uint)pAVar15->pFanin0 & 1) ^ *(ulong *)(uVar14 + 0x28));
        }
        uVar14 = (ulong)pAVar15->pFanin1 & 0xfffffffffffffffe;
        if (uVar14 == 0) {
          pAVar19 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar19 = (Aig_Obj_t *)((ulong)((uint)pAVar15->pFanin1 & 1) ^ *(ulong *)(uVar14 + 0x28));
        }
        pAVar21 = Aig_And(p_00,pAVar21,pAVar19);
        (pAVar15->field_5).pData = pAVar21;
      }
      lVar22 = lVar22 + 1;
      pVVar8 = p->vObjs;
    } while (lVar22 < pVVar8->nSize);
  }
  if ((uint)mode < 2) {
    if (vAssertSafety->nSize == 0) {
LAB_00621ce1:
      puts("WARNING!! No safety property is found, a new (negated) constant 1 output is created");
      pAVar21 = p_00->pConst1;
LAB_00621cf6:
      pAVar21 = (Aig_Obj_t *)((ulong)pAVar21 ^ 1);
    }
    else {
      if (vAssumeSafety->nSize == 0) {
        pAVar21 = p_00->pConst1;
        if (0 < vAssertSafety->nSize) {
          lVar22 = 0;
          do {
            pAVar15 = (Aig_Obj_t *)vAssertSafety->pArray[lVar22];
            pAVar21 = Aig_And(p_00,(Aig_Obj_t *)
                                   ((ulong)((uint)pAVar15->pFanin0 & 1) ^
                                   *(ulong *)(((ulong)pAVar15->pFanin0 & 0xfffffffffffffffe) + 0x28)
                                   ),pAVar21);
            lVar22 = lVar22 + 1;
          } while (lVar22 < vAssertSafety->nSize);
        }
        goto LAB_00621cf6;
      }
      if ((vAssertSafety->nSize == 0) || (vAssumeSafety->nSize == 0)) goto LAB_00621ce1;
      pAVar21 = p_00->pConst1;
      if (0 < vAssertSafety->nSize) {
        lVar22 = 0;
        do {
          pAVar15 = (Aig_Obj_t *)vAssertSafety->pArray[lVar22];
          pAVar21 = Aig_And(p_00,(Aig_Obj_t *)
                                 ((ulong)((uint)pAVar15->pFanin0 & 1) ^
                                 *(ulong *)(((ulong)pAVar15->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                            pAVar21);
          lVar22 = lVar22 + 1;
        } while (lVar22 < vAssertSafety->nSize);
      }
      pAVar19 = p_00->pConst1;
      if (0 < vAssumeSafety->nSize) {
        lVar22 = 0;
        do {
          pAVar15 = (Aig_Obj_t *)vAssumeSafety->pArray[lVar22];
          pAVar19 = Aig_And(p_00,(Aig_Obj_t *)
                                 ((ulong)((uint)pAVar15->pFanin0 & 1) ^
                                 *(ulong *)(((ulong)pAVar15->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                            pAVar19);
          lVar22 = lVar22 + 1;
        } while (lVar22 < vAssumeSafety->nSize);
      }
      pAVar21 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar21 ^ 1),pAVar19);
    }
    Aig_ObjCreateCo(p_00,pAVar21);
  }
  iVar20 = 0;
  if ((mode & 0xfffffffdU) == 0) {
    pAVar15 = Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)
                                    (((ulong)pAVar15->pFanin0 & 0xfffffffffffffffe) + 0x28));
  }
  else {
    pAVar15 = (Aig_Obj_t *)0x0;
  }
  if (0 < p->nRegs) {
    iVar20 = 0;
    do {
      iVar6 = p->nTruePis;
      uVar5 = iVar20 + iVar6;
      if (((int)uVar5 < 0) || (p->vCis->nSize <= (int)uVar5)) goto LAB_00622833;
      piVar2 = (int *)p->vCis->pArray[uVar5];
      if (((piVar2[6] & 7U) != 2) || (iVar4 = *piVar2, iVar4 < iVar6)) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar5 = (iVar4 - iVar6) + p->nTruePos;
      if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar5)) goto LAB_00622833;
      uVar14 = *(ulong *)((long)p->vCos->pArray[uVar5] + 8);
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                           ((ulong)((uint)uVar14 & 1) ^
                           *(ulong *)((uVar14 & 0xfffffffffffffffe) + 0x28)));
      iVar20 = iVar20 + 1;
    } while (iVar20 < p->nRegs);
  }
  if ((mode & 0xfffffffdU) != 0) {
    local_48 = (Aig_Obj_t *)0x0;
    iVar6 = 1;
    iVar4 = 0;
    goto LAB_00622680;
  }
  local_48 = Aig_ObjCreateCo(p_00,local_68);
  local_98 = p_00->pConst1;
  if (0 < p->nRegs) {
    uVar5 = 0;
    do {
      iVar6 = p->nTruePis + uVar5;
      if ((((iVar6 < 0) || (p->vCis->nSize <= iVar6)) ||
          (uVar7 = pNtk->vPis->nSize + uVar5, (int)uVar7 < 0)) || (pNtk->vCis->nSize <= (int)uVar7))
      goto LAB_00622833;
      pcVar13 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar7]);
      printf("Flop[%d] = %s\n",(ulong)uVar5,pcVar13);
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < p->nRegs);
  }
  if (0 < vFlops->nSize) {
    lVar22 = 0;
    do {
      uVar5 = vFlops->pArray[lVar22];
      pAVar21 = Aig_ObjCreateCi(p_00);
      pVVar8 = vecLos;
      uVar7 = (p->nObjs[2] - p->nRegs) + uVar5;
      if (((int)uVar7 < 0) || (p->vCis->nSize <= (int)uVar7)) goto LAB_00622833;
      pvVar3 = p->vCis->pArray[uVar7];
      uVar7 = vecLos->nCap;
      if (vecLos->nSize == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar7 * 2;
          if (iVar6 <= (int)uVar7) goto LAB_00621f4f;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecLos->pArray,(ulong)uVar7 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar6;
      }
LAB_00621f4f:
      iVar6 = pVVar8->nSize;
      pVVar8->nSize = iVar6 + 1;
      pVVar8->pArray[iVar6] = pAVar21;
      uVar7 = pNtk->vPis->nSize + uVar5;
      if (((int)uVar7 < 0) || (pNtk->vCis->nSize <= (int)uVar7)) goto LAB_00622833;
      pcVar13 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar7]);
      sVar10 = strlen(pcVar13);
      pcVar13 = (char *)malloc(sVar10 + 10);
      uVar7 = pNtk->vPis->nSize + uVar5;
      if (((int)uVar7 < 0) || (pNtk->vCis->nSize <= (int)uVar7)) goto LAB_00622833;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar7]);
      sprintf(pcVar13,"%s__%s",pcVar11,"SHADOW");
      printf("Flop copied [%d] = %s\n",(ulong)uVar5,pcVar13);
      pVVar8 = vecLoNames;
      uVar5 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar5 * 2;
          if (iVar6 <= (int)uVar5) goto LAB_0062207b;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar6;
      }
LAB_0062207b:
      iVar6 = pVVar8->nSize;
      pVVar8->nSize = iVar6 + 1;
      pVVar8->pArray[iVar6] = pcVar13;
      pAVar19 = Aig_Mux(p_00,local_60,*(Aig_Obj_t **)((long)pvVar3 + 0x28),pAVar21);
      Aig_ObjCreateCo(p_00,pAVar19);
      pAVar21 = Aig_Exor(p_00,*(Aig_Obj_t **)((long)pvVar3 + 0x28),pAVar21);
      local_98 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar21 ^ 1),local_98);
      lVar22 = lVar22 + 1;
    } while (lVar22 < vFlops->nSize);
    iVar20 = iVar20 + (int)lVar22;
  }
  iVar20 = iVar20 + 1;
  pAVar19 = Aig_And(p_00,pAVar12,local_98);
  pAVar21 = p_00->pConst1;
  if ((vLive == (Vec_Ptr_t *)0x0) || (vLive->nSize == 0)) {
    puts("Circuit without any liveness property");
LAB_006223a8:
    iVar6 = 1;
  }
  else {
    if (vLive->nSize < 1) goto LAB_006223a8;
    lVar22 = 0;
    do {
      pAVar17 = (Aig_Obj_t *)vLive->pArray[lVar22];
      pAVar18 = pAVar17->pFanin0;
      uVar14 = *(ulong *)(((ulong)pAVar18 & 0xfffffffffffffffe) + 0x28);
      pAVar16 = Aig_ObjCreateCi(p_00);
      pVVar8 = vecLos;
      uVar5 = vecLos->nCap;
      if (vecLos->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar5 * 2;
          if (iVar6 <= (int)uVar5) goto LAB_006221f0;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar6;
      }
LAB_006221f0:
      iVar6 = pVVar8->nSize;
      pVVar8->nSize = iVar6 + 1;
      pVVar8->pArray[iVar6] = pAVar16;
      uVar5 = getPoIndex(p,pAVar17);
      if (((int)uVar5 < 0) || (pNtk->vPos->nSize <= (int)uVar5)) goto LAB_00622833;
      pcVar13 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[uVar5]);
      sVar10 = strlen(pcVar13);
      pcVar13 = (char *)malloc(sVar10 + 0xc);
      uVar5 = getPoIndex(p,pAVar17);
      if (((int)uVar5 < 0) || (pNtk->vPos->nSize <= (int)uVar5)) goto LAB_00622833;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[uVar5]);
      sprintf(pcVar13,"%s__%s",pcVar11,"LIVENESS");
      pVVar8 = vecLoNames;
      uVar5 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar5 * 2;
          if (iVar6 <= (int)uVar5) goto LAB_00622313;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar6;
      }
LAB_00622313:
      lVar22 = lVar22 + 1;
      iVar6 = pVVar8->nSize;
      pVVar8->nSize = iVar6 + 1;
      pVVar8->pArray[iVar6] = pcVar13;
      pAVar17 = Aig_And(p_00,(Aig_Obj_t *)((uint)pAVar18 & 1 ^ uVar14),local_68);
      pAVar17 = Aig_Or(p_00,pAVar16,pAVar17);
      Aig_ObjCreateCo(p_00,pAVar17);
      pAVar21 = Aig_And(p_00,pAVar16,pAVar21);
    } while (lVar22 < vLive->nSize);
    iVar20 = iVar20 + (int)lVar22;
    iVar6 = (int)lVar22 + 1;
  }
  pAVar17 = p_00->pConst1;
  if ((vFair == (Vec_Ptr_t *)0x0) || (vFair->nSize == 0)) {
    puts("Circuit without any fairness property");
LAB_0062264a:
    lVar22 = 0;
  }
  else {
    if (vFair->nSize < 1) goto LAB_0062264a;
    lVar22 = 0;
    do {
      pAVar18 = (Aig_Obj_t *)vFair->pArray[lVar22];
      pAVar16 = pAVar18->pFanin0;
      uVar14 = *(ulong *)(((ulong)pAVar16 & 0xfffffffffffffffe) + 0x28);
      p0 = Aig_ObjCreateCi(p_00);
      pVVar8 = vecLos;
      uVar5 = vecLos->nCap;
      if (vecLos->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar5 * 2;
          if (iVar4 <= (int)uVar5) goto LAB_0062248b;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecLos->pArray,(ulong)uVar5 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar4;
      }
LAB_0062248b:
      iVar4 = pVVar8->nSize;
      pVVar8->nSize = iVar4 + 1;
      pVVar8->pArray[iVar4] = p0;
      uVar5 = getPoIndex(p,pAVar18);
      if (((int)uVar5 < 0) || (pNtk->vPos->nSize <= (int)uVar5)) goto LAB_00622833;
      pcVar13 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[uVar5]);
      sVar10 = strlen(pcVar13);
      pcVar13 = (char *)malloc(sVar10 + 0xc);
      uVar5 = getPoIndex(p,pAVar18);
      if (((int)uVar5 < 0) || (pNtk->vPos->nSize <= (int)uVar5)) goto LAB_00622833;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[uVar5]);
      sprintf(pcVar13,"%s__%s",pcVar11,"FAIRNESS");
      pVVar8 = vecLoNames;
      uVar5 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar5 * 2;
          if (iVar4 <= (int)uVar5) goto LAB_006225b1;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(vecLoNames->pArray,(ulong)uVar5 << 4);
          }
          pVVar8->pArray = ppvVar9;
        }
        pVVar8->nCap = iVar4;
      }
LAB_006225b1:
      lVar22 = lVar22 + 1;
      iVar4 = pVVar8->nSize;
      pVVar8->nSize = iVar4 + 1;
      pVVar8->pArray[iVar4] = pcVar13;
      pAVar18 = Aig_And(p_00,(Aig_Obj_t *)((uint)pAVar16 & 1 ^ uVar14),local_68);
      pAVar18 = Aig_Or(p_00,p0,pAVar18);
      Aig_ObjCreateCo(p_00,pAVar18);
      pAVar17 = Aig_And(p_00,p0,pAVar17);
    } while (lVar22 < vFair->nSize);
    iVar20 = iVar20 + (int)lVar22;
  }
  iVar4 = (int)lVar22;
  pAVar21 = Aig_And(p_00,pAVar17,(Aig_Obj_t *)((ulong)pAVar21 ^ 1));
  pAVar21 = Aig_And(p_00,pAVar19,pAVar21);
  Aig_ObjPatchFanin0(p_00,pAVar15,pAVar21);
LAB_00622680:
  Aig_ManSetRegNum(p_00,iVar20);
  iVar20 = p_00->vCis->nSize;
  p_00->nObjs[2] = iVar20;
  iVar1 = p_00->nRegs;
  if (iVar1 != 0) {
    p_00->nTruePis = iVar20 - iVar1;
  }
  iVar20 = p_00->vCos->nSize;
  p_00->nObjs[3] = iVar20;
  if (iVar1 != 0) {
    p_00->nTruePos = iVar20 - iVar1;
  }
  Aig_ManCleanup(p_00);
  iVar20 = Aig_ManCheck(p_00);
  if (iVar20 == 0) {
    __assert_fail("Aig_ManCheck( pNew )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                  ,0x33d,
                  "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if ((mode & 0xfffffffdU) == 0) {
    if (0xfffffffd < (*(uint *)&pAVar12->field_0x18 & 7) - 7) {
      __assert_fail("!Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
    }
    uVar5 = ~p->nTruePis + (pAVar12->field_0).CioId + p_00->nTruePos;
    if (((int)uVar5 < 0) || (p_00->vCos->nSize <= (int)uVar5)) {
LAB_00622833:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((Aig_Obj_t *)p_00->vCos->pArray[uVar5] != local_48) {
      __assert_fail("(Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x341,
                    "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p->nTruePis + 1U != p_00->nTruePis) {
      __assert_fail("Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x342,
                    "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    if (p_00->nRegs != iVar6 + iVar4 + p->nRegs + vFlops->nSize) {
      __assert_fail("Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + liveLatch + fairLatch"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x343,
                    "Aig_Man_t *LivenessToSafetyTransformationAbs(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
  }
  return p_00;
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationAbs( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, Vec_Int_t *vFlops, 
                                           Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety )
{
    Aig_Man_t * pNew;
    int i, nRegCount, iEntry;
    Aig_Obj_t * pObjSavePi = NULL;
    Aig_Obj_t *pObjSavedLi = NULL, *pObjSavedLo = NULL;
    Aig_Obj_t *pObj, *pMatch;
    Aig_Obj_t *pObjSavedLoAndEquality, *pObjSaveOrSaved = NULL, *pObjSaveAndNotSaved = NULL;
    Aig_Obj_t *pObjShadowLo, *pObjShadowLi, *pObjShadowLiDriver;
    Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc;
    Aig_Obj_t *pObjLive, *pObjFair, *pObjSafetyGate;
    Aig_Obj_t *pObjSafetyPropertyOutput = NULL;
    Aig_Obj_t *pDriverImage, *pArgument, *collectiveAssertSafety, *collectiveAssumeSafety;
    char *nodeName;
    int piCopied = 0, liCopied = 0, loCopied = 0, liCreated = 0, loCreated = 0, liveLatch = 0, fairLatch = 0;//, piVecIndex = 0;
    
    vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
    vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

    vecLos = Vec_PtrAlloc( Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
    vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

    //****************************************************************
    // Step1: create the new manager
    // Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
    // nodes, but this selection is arbitrary - need to be justified
    //****************************************************************
    pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
    pNew->pName = (char *)malloc( strlen( pNtk->pName ) + strlen("_l2s") + 1 );
    sprintf(pNew->pName, "%s_%s", pNtk->pName, "l2s");
    pNew->pSpec = NULL;
    
    //****************************************************************
    // Step 2: map constant nodes
    //****************************************************************
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );

    //****************************************************************
    // Step 3: create true PIs
    //****************************************************************
    Saig_ManForEachPi( p, pObj, i )
    {
        piCopied++;
        pObj->pData = Aig_ObjCreateCi(pNew);
        Vec_PtrPush( vecPis, pObj->pData );
        nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
        Vec_PtrPush( vecPiNames, nodeName );
    }

    //****************************************************************
    // Step 4: create the special Pi corresponding to SAVE
    //****************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        pObjSavePi = Aig_ObjCreateCi( pNew );
        nodeName = "SAVE_BIERE",
        Vec_PtrPush( vecPiNames, nodeName );
    }
        
    //****************************************************************
    // Step 5: create register outputs
    //****************************************************************
    Saig_ManForEachLo( p, pObj, i )
    {
        loCopied++;
        pObj->pData = Aig_ObjCreateCi(pNew);
        Vec_PtrPush( vecLos, pObj->pData );
        nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
        Vec_PtrPush( vecLoNames, nodeName );
    }

    //****************************************************************
    // Step 6: create "saved" register output
    //****************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        loCreated++;
        pObjSavedLo = Aig_ObjCreateCi( pNew );
        Vec_PtrPush( vecLos, pObjSavedLo );
        nodeName = "SAVED_LO";
        Vec_PtrPush( vecLoNames, nodeName );
    }

    //****************************************************************
    // Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
    //****************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
        pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
    }

    //********************************************************************
    // Step 8: create internal nodes
    //********************************************************************
    Aig_ManForEachNode( p, pObj, i )
    {
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }

    
    //********************************************************************
    // Step 8.x : create PO for each safety assertions
    // NOTE : Here the output is purposely inverted as it will be thrown to 
    // dprove
    //********************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
    {
        if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
        {
            pObjAndAcc = Aig_ManConst1( pNew );
            Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
            {
                pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
            }
            Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
        }
        else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
        {
            pObjAndAcc = Aig_ManConst1( pNew );
            Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
            {
                pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
            }
            collectiveAssertSafety = pObjAndAcc;

            pObjAndAcc = Aig_ManConst1( pNew );
            Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
            {
                pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
            }
            collectiveAssumeSafety = pObjAndAcc;
            Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
        }
        else
        {
            printf("WARNING!! No safety property is found, a new (negated) constant 1 output is created\n");
            Aig_ObjCreateCo( pNew, Aig_Not( Aig_ManConst1(pNew) ) );
        }
    }

    //********************************************************************
    // Step 9: create the safety property output gate for the liveness properties
    // discuss with Sat/Alan for an alternative implementation
    //********************************************************************
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
    }

    // create register inputs for the original registers
    nRegCount = 0;
    
    Saig_ManForEachLo( p, pObj, i )
    {
        pMatch = Saig_ObjLoToLi( p, pObj );
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
        nRegCount++;
        liCopied++;
    }

    // create register input corresponding to the register "saved"
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        #ifndef DUPLICATE_CKT_DEBUG
            pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
            nRegCount++;
            liCreated++;

            //Changed on October 13, 2009
            //pObjAndAcc = NULL;
            pObjAndAcc = Aig_ManConst1( pNew );

    // create the family of shadow registers, then create the cascade of Xnor and And gates for the comparator 
            //Saig_ManForEachLo( p, pObj, i )
            Saig_ManForEachLo( p, pObj, i )
            {
                printf("Flop[%d] = %s\n", i, Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ) );
            }
            Vec_IntForEachEntry( vFlops, iEntry, i )
            {
                pObjShadowLo = Aig_ObjCreateCi( pNew );
                pObj = Aig_ManLo( p, iEntry );

                #ifdef PROPAGATE_NAMES
                    Vec_PtrPush( vecLos, pObjShadowLo );
                    nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + iEntry ) ) ) + 10 );
                    sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + iEntry ) ), "SHADOW" );
                    printf("Flop copied [%d] = %s\n", iEntry, nodeName );
                    Vec_PtrPush( vecLoNames, nodeName );
                #endif

                pObjShadowLiDriver = Aig_Mux( pNew, pObjSaveAndNotSaved, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                nRegCount++;
                loCreated++; liCreated++;
        
                pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                pObjXnor = Aig_Not( pObjXor );
                
                pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAcc );
            }

            // create the AND gate whose output will be the signal "looped"
            pObjSavedLoAndEquality = Aig_And( pNew, pObjSavedLo, pObjAndAcc );

            // create the master AND gate and corresponding AND and OR logic for the liveness properties
            pObjAndAcc = Aig_ManConst1( pNew );
            if( vLive == NULL || Vec_PtrSize( vLive ) == 0 )
            {
                printf("Circuit without any liveness property\n");
            }
            else
            {
                Vec_PtrForEachEntry( Aig_Obj_t *, vLive, pObj, i )
                {
                    liveLatch++;
                    pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
                    pObjShadowLo = Aig_ObjCreateCi( pNew );

                    #ifdef PROPAGATE_NAMES
                        Vec_PtrPush( vecLos, pObjShadowLo );
                        nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                        sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
                        Vec_PtrPush( vecLoNames, nodeName );
                    #endif

                    pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
                    pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                    nRegCount++;
                    loCreated++; liCreated++;
            
                    pObjAndAcc = Aig_And( pNew, pObjShadowLo, pObjAndAcc );
                }
            }

            pObjLive = pObjAndAcc;
                
            pObjAndAcc = Aig_ManConst1( pNew );
            if( vFair == NULL || Vec_PtrSize( vFair ) == 0 )
                printf("Circuit without any fairness property\n");
            else
            {
                Vec_PtrForEachEntry( Aig_Obj_t *, vFair, pObj, i )
                {
                    fairLatch++;
                    pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
                    pObjShadowLo = Aig_ObjCreateCi( pNew );

                    #ifdef PROPAGATE_NAMES
                        Vec_PtrPush( vecLos, pObjShadowLo );
                        nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                        sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "FAIRNESS" );
                        Vec_PtrPush( vecLoNames, nodeName );
                    #endif

                    pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
                    pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                    nRegCount++;
                    loCreated++; liCreated++;
            
                    pObjAndAcc = Aig_And( pNew, pObjShadowLo, pObjAndAcc );
                }
            }

            pObjFair = pObjAndAcc;
                
            //pObjSafetyGate = Aig_Exor( pNew, Aig_Not(Aig_ManConst1( pNew )), Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) ) );
            //Following is the actual Biere translation
            pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) );

            Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
        #endif
    }

    Aig_ManSetRegNum( pNew, nRegCount );

    Aig_ManCiCleanupBiere( pNew );
    Aig_ManCoCleanupBiere( pNew );
    
    Aig_ManCleanup( pNew );
    
    assert( Aig_ManCheck( pNew ) );
    
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
            assert((Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi);
            assert( Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew ) );
            assert( Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) + Vec_IntSize( vFlops ) + 1 + liveLatch + fairLatch );
    }

    return pNew;
}